

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O1

uchar * extract_message(uint *c1,uint c_len,uint t,uint *output_len)

{
  uchar *s;
  uchar *puVar1;
  ulong uVar2;
  
  s = (uchar *)calloc((ulong)(c_len + 1),1);
  if (c_len != 0) {
    uVar2 = 0;
    do {
      s[uVar2] = (uchar)c1[uVar2];
      uVar2 = uVar2 + 1;
    } while (c_len != uVar2);
  }
  puVar1 = substring(s,t * 2,c_len - 1,output_len);
  free(s);
  return puVar1;
}

Assistant:

uint8_t *extract_message(uint32_t *c1, uint32_t c_len, uint32_t t, uint32_t *output_len)
{
    uint8_t *M = vector_to_str(c1, c_len);
    uint8_t *ret = substring(M, 2 * t, c_len - 1, output_len);
    free(M);
    return ret;
}